

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_normal_attribute_decoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialNormalAttributeDecoder::Init
          (SequentialNormalAttributeDecoder *this,PointCloudDecoder *decoder,int attribute_id)

{
  bool bVar1;
  uint8_t uVar2;
  DataType DVar3;
  PointAttribute *pPVar4;
  undefined4 in_EDX;
  SequentialIntegerAttributeDecoder *in_RSI;
  SequentialAttributeDecoder *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  undefined1 local_1;
  
  bVar1 = SequentialIntegerAttributeDecoder::Init
                    (in_RSI,(PointCloudDecoder *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    pPVar4 = SequentialAttributeDecoder::attribute(in_RDI);
    uVar2 = GeometryAttribute::num_components(&pPVar4->super_GeometryAttribute);
    if (uVar2 == '\x03') {
      pPVar4 = SequentialAttributeDecoder::attribute(in_RDI);
      DVar3 = GeometryAttribute::data_type(&pPVar4->super_GeometryAttribute);
      if (DVar3 == DT_FLOAT32) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SequentialNormalAttributeDecoder::Init(PointCloudDecoder *decoder,
                                            int attribute_id) {
  if (!SequentialIntegerAttributeDecoder::Init(decoder, attribute_id)) {
    return false;
  }
  // Currently, this encoder works only for 3-component normal vectors.
  if (attribute()->num_components() != 3) {
    return false;
  }
  // Also the data type must be DT_FLOAT32.
  if (attribute()->data_type() != DT_FLOAT32) {
    return false;
  }
  return true;
}